

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::unit_to_the_power_of(string *unit_string,int power,uint64_t match_flags)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  size_t sVar4;
  undefined8 extraout_RAX_01;
  ulong in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double in_XMM1_Qa;
  precise_unit pVar7;
  uint64_t in_stack_00000020;
  string *in_stack_00000028;
  size_t fnd;
  precise_unit a_unit;
  string ustring;
  int index;
  bool partialPowerSegment;
  precise_unit retunit;
  uint32_t recursion_modifier;
  uint64_t in_stack_00000cb8;
  string *in_stack_00000cc0;
  size_type in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int *in_stack_fffffffffffffda8;
  precise_unit *in_stack_fffffffffffffdb0;
  precise_unit *utest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  uint64_t in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  precise_unit *local_188;
  undefined8 local_180;
  allocator<char> local_171 [33];
  size_t local_150;
  precise_unit *local_148;
  undefined8 local_140;
  double local_118;
  undefined8 local_110;
  precise_unit *local_108;
  precise_unit *local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  precise_unit *local_c0;
  undefined8 uStack_b8;
  precise_unit *local_80;
  undefined8 uStack_78;
  int local_50;
  byte local_49;
  precise_unit local_48;
  undefined4 local_2c;
  ulong local_28;
  int local_1c;
  precise_unit *local_10;
  undefined8 local_8;
  
  local_2c = 0x8000;
  if ((in_RDX & 0x20000) != 0) {
    local_2c = 0;
  }
  local_48.multiplier_ = NAN;
  local_48.base_units_ = (unit_data)0xfa94a488;
  local_48.commodity_ = 0;
  local_28 = in_RDX;
  local_1c = in_ESI;
  pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           back(in_stack_fffffffffffffda0);
  local_49 = *pvVar2 == ')';
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  local_50 = (int)sVar3 + -2;
  if ((((local_49 & 1) != 0) &&
      (segmentcheckReverse((string *)in_stack_fffffffffffffdb8,
                           (char)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                           in_stack_fffffffffffffda8), 0 < local_50)) &&
     (pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98), *pvVar2 == '^')) {
    local_49 = 0;
  }
  if ((local_49 & 1) == 0) {
    if ((local_28 & 0x200) != 0) {
      cleanUnitString(in_stack_00000028,in_stack_00000020);
    }
    pVar7 = get_unit((string *)in_RDI,in_stack_fffffffffffffe48);
    local_140 = pVar7._8_8_;
    local_148 = (precise_unit *)pVar7.multiplier_;
    local_48.multiplier_ = (double)local_148;
    local_48._8_8_ = local_140;
    bVar1 = is_valid(in_stack_fffffffffffffdb0);
    if (bVar1) {
      if (local_1c == 1) {
        local_10 = (precise_unit *)local_48.multiplier_;
        local_8._0_4_ = local_48.base_units_;
        local_8._4_4_ = local_48.commodity_;
      }
      else if (local_1c == -1) {
        pVar7 = precise_unit::inv(in_stack_fffffffffffffdb0);
        local_8 = pVar7._8_8_;
        local_10 = (precise_unit *)pVar7.multiplier_;
      }
      else {
        local_10 = (precise_unit *)
                   precise_unit::pow(&local_48,
                                     (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
                                     in_XMM1_Qa);
        local_8 = extraout_RAX_00;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,
                 (char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                 in_stack_fffffffffffffdd0);
      sVar4 = findWordOperatorSep(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      std::__cxx11::string::~string(in_stack_fffffffffffffda0);
      std::allocator<char>::~allocator(local_171);
      if (sVar4 == 0xffffffffffffffff) {
        this = &local_1a8;
        local_150 = sVar4;
        std::__cxx11::string::string
                  (in_stack_fffffffffffffde0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        pVar7 = unit_from_string_internal(in_stack_00000cc0,in_stack_00000cb8);
        local_180 = pVar7._8_8_;
        utest = (precise_unit *)pVar7.multiplier_;
        local_188 = utest;
        local_48.multiplier_ = (double)utest;
        local_48._8_8_ = local_180;
        std::__cxx11::string::~string(this);
        bVar1 = is_valid(utest);
        if (bVar1) {
          if (local_1c == 1) {
            local_10 = (precise_unit *)local_48.multiplier_;
            local_8._0_4_ = local_48.base_units_;
            local_8._4_4_ = local_48.commodity_;
          }
          else if (local_1c == -1) {
            pVar7 = precise_unit::inv(utest);
            local_8 = pVar7._8_8_;
            local_10 = (precise_unit *)pVar7.multiplier_;
          }
          else {
            local_10 = (precise_unit *)
                       precise_unit::pow(&local_48,
                                         (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),
                                         in_XMM1_Qa);
            local_8 = extraout_RAX_01;
          }
        }
        else {
          local_10 = (precise_unit *)0x7ff4000000000000;
          local_8._0_4_ = (unit_data)0xfa94a488;
          local_8._4_4_ = 0;
        }
      }
      else {
        local_10 = (precise_unit *)0x3ff0000000000000;
        local_8._0_4_ = (unit_data)0x30000000;
        local_8._4_4_ = 0;
      }
    }
    goto LAB_0079c005;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI)
  ;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffdb8,(size_type)in_stack_fffffffffffffdb0,
             (size_type)in_stack_fffffffffffffda8);
  std::__cxx11::string::string
            (in_stack_fffffffffffffde0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  pVar7 = unit_from_string_internal(in_stack_00000cc0,in_stack_00000cb8);
  uStack_78 = pVar7._8_8_;
  local_80 = (precise_unit *)pVar7.multiplier_;
  local_48.multiplier_ = (double)local_80;
  local_48._8_8_ = uStack_78;
  std::__cxx11::string::~string(in_stack_fffffffffffffda0);
  bVar1 = is_valid(in_stack_fffffffffffffdb0);
  uVar5 = extraout_XMM0_Da;
  uVar6 = extraout_XMM0_Db;
  if (bVar1) {
LAB_0079ba58:
    if (local_1c == -1) {
      pVar7 = precise_unit::inv(in_stack_fffffffffffffdb0);
      local_f0 = pVar7._8_8_;
      local_f8 = (precise_unit *)pVar7.multiplier_;
      local_48.multiplier_ = (double)local_f8;
      local_48._8_8_ = local_f0;
    }
    else if (local_1c != 1) {
      local_108 = (precise_unit *)
                  precise_unit::pow(&local_48,(double)CONCAT44(uVar6,uVar5),in_XMM1_Qa);
      local_48.multiplier_ = (double)local_108;
      local_48._8_8_ = extraout_RAX;
    }
    if (local_50 < 0) {
      local_10 = (precise_unit *)local_48.multiplier_;
      local_8._0_4_ = local_48.base_units_;
      local_8._4_4_ = local_48.commodity_;
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffdb8,(size_type)in_stack_fffffffffffffdb0,
                 (size_type)in_stack_fffffffffffffda8);
      pVar7 = unit_from_string_internal(in_stack_00000cc0,in_stack_00000cb8);
      local_110 = pVar7._8_8_;
      local_118 = pVar7.multiplier_;
      std::__cxx11::string::~string(in_stack_fffffffffffffda0);
      bVar1 = is_error(in_stack_fffffffffffffdb0);
      if (bVar1) {
        local_10 = (precise_unit *)0x3ff0000000000000;
        local_8._0_4_ = (unit_data)0x30000000;
        local_8._4_4_ = 0;
      }
      else {
        pVar7 = precise_unit::operator*
                          ((precise_unit *)in_stack_fffffffffffffdc0,
                           (precise_unit *)in_stack_fffffffffffffdb8);
        local_8 = pVar7._8_8_;
        local_10 = (precise_unit *)pVar7.multiplier_;
      }
    }
  }
  else if (local_50 < 0) {
    local_10 = (precise_unit *)0x7ff4000000000000;
    local_8._0_4_ = (unit_data)0xfa94a488;
    local_8._4_4_ = 0;
  }
  else {
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                          (size_type)in_stack_fffffffffffffdb0);
    if (sVar3 == 0xffffffffffffffff) {
      std::__cxx11::string::string
                (in_stack_fffffffffffffde0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      pVar7 = unit_from_string_internal(in_stack_00000cc0,in_stack_00000cb8);
      uStack_b8 = pVar7._8_8_;
      local_c0 = (precise_unit *)pVar7.multiplier_;
      local_48.multiplier_ = (double)local_c0;
      local_48._8_8_ = uStack_b8;
      std::__cxx11::string::~string(in_stack_fffffffffffffda0);
      bVar1 = is_valid(in_stack_fffffffffffffdb0);
      if (bVar1) {
        local_50 = -1;
        uVar5 = extraout_XMM0_Da_00;
        uVar6 = extraout_XMM0_Db_00;
        goto LAB_0079ba58;
      }
      local_10 = (precise_unit *)0x7ff4000000000000;
      local_8._0_4_ = (unit_data)0xfa94a488;
      local_8._4_4_ = 0;
    }
    else {
      local_10 = (precise_unit *)0x7ff4000000000000;
      local_8._0_4_ = (unit_data)0xfa94a488;
      local_8._4_4_ = 0;
    }
  }
  local_e4 = 1;
  std::__cxx11::string::~string(in_stack_fffffffffffffda0);
LAB_0079c005:
  pVar7.base_units_ = local_8._0_4_;
  pVar7.commodity_ = local_8._4_4_;
  pVar7.multiplier_ = (double)local_10;
  return pVar7;
}

Assistant:

static precise_unit unit_to_the_power_of(
    std::string unit_string,
    int power,
    std::uint64_t match_flags)
{
    std::uint32_t recursion_modifier = recursion_depth1;
    if ((match_flags & no_recursion) != 0) {
        recursion_modifier = 0;
    }

    precise_unit retunit = precise::invalid;
    bool partialPowerSegment = (unit_string.back() == ')');
    int index = static_cast<int>(unit_string.size() - 2);
    if (partialPowerSegment) {
        segmentcheckReverse(unit_string, '(', index);
        if (index > 0 && unit_string[index] == '^') {
            partialPowerSegment = false;
        }
    }
    if (partialPowerSegment) {
        std::string ustring = unit_string.substr(
            static_cast<size_t>(index) + 2,
            unit_string.size() - static_cast<size_t>(index) - 3);
        retunit = unit_from_string_internal(
            ustring, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            if (index >= 0) {
                if (ustring.find_first_of("(*/^{[") == std::string::npos) {
                    retunit = unit_from_string_internal(
                        unit_string, match_flags - recursion_modifier);
                    if (!is_valid(retunit)) {
                        return precise::invalid;
                    }
                    index = -1;
                } else {
                    return precise::invalid;
                }
            } else {
                return precise::invalid;
            }
        }

        if (power == -1) {
            retunit = retunit.inv();
        } else if (power != 1) {
            retunit = retunit.pow(power);
        }

        if (index < 0) {
            return retunit;
        }
        auto a_unit = unit_from_string_internal(
            unit_string.substr(0, index), match_flags - recursion_modifier);
        if (!is_error(a_unit)) {
            return a_unit * retunit;
        }
        return precise::defunit;
    }
    // auto ustring = unit_string.substr(0, pchar + 1);

    if ((match_flags & case_insensitive) != 0) {
        cleanUnitString(unit_string, match_flags);
    }

    retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    auto fnd = findWordOperatorSep(unit_string, "per");
    if (fnd == std::string::npos) {
        retunit = unit_from_string_internal(
            unit_string, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            return precise::invalid;
        }
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    return precise::defunit;
}